

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  byte bVar2;
  cmake *this_00;
  string *psVar3;
  type pcVar4;
  ostream *poVar5;
  undefined1 local_51;
  undefined1 local_50 [32];
  string rulesFilePath;
  cmGlobalNinjaGenerator *this_local;
  
  rulesFilePath.field_2._8_8_ = this;
  this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)(local_50 + 0x18),(string *)psVar3);
  std::__cxx11::string::operator+=((string *)(local_50 + 0x18),"/");
  std::__cxx11::string::operator+=((string *)(local_50 + 0x18),NINJA_RULES_FILE);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->RulesFileStream);
  if (!bVar1) {
    local_51 = None;
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (bool *)(local_50 + 0x18),(Encoding *)&local_51);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
              (&this->RulesFileStream,
               (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_50);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_50);
    pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->RulesFileStream);
    bVar2 = std::ios::operator!((ios *)((long)&(pcVar4->super_ofstream).
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream +
                                       (long)(pcVar4->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream[-3]));
    if ((bVar2 & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_003fd374;
    }
  }
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->RulesFileStream);
  WriteDisclaimer(this,(ostream *)pcVar4);
  pcVar4 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->RulesFileStream);
  poVar5 = std::operator<<((ostream *)pcVar4,
                           "# This file contains all the rules used to get the outputs files\n");
  poVar5 = std::operator<<(poVar5,"# built from the input files.\n");
  poVar5 = std::operator<<(poVar5,"# It is included in the main \'");
  poVar5 = std::operator<<(poVar5,NINJA_BUILD_FILE);
  std::operator<<(poVar5,"\'.\n\n");
  this_local._7_1_ = true;
LAB_003fd374:
  std::__cxx11::string::~string((string *)(local_50 + 0x18));
  return this_local._7_1_;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  // Compute Ninja's build file path.
  std::string rulesFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  rulesFilePath += "/";
  rulesFilePath += cmGlobalNinjaGenerator::NINJA_RULES_FILE;

  // Get a stream where to generate things.
  if (!this->RulesFileStream) {
    this->RulesFileStream = cm::make_unique<cmGeneratedFileStream>(
      rulesFilePath, false, this->GetMakefileEncoding());
    if (!(*this->RulesFileStream)) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return false;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->RulesFileStream);

  // Write comment about this file.
  /* clang-format off */
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
  /* clang-format on */
  return true;
}